

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pattern.h
# Opt level: O0

PatternView *
ZXing::FindLeftGuard<6,bool(*)(ZXing::PatternView_const&,int)>
          (PatternView *view,int minSize,_func_bool_PatternView_ptr_int *isGuard)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  Iterator puVar4;
  Iterator puVar5;
  ulong uVar6;
  code *in_RCX;
  int in_EDX;
  PatternView *in_RSI;
  PatternView *in_RDI;
  Iterator end;
  PatternView window;
  PatternView *pPVar7;
  PatternView *in_stack_ffffffffffffffc0;
  PatternView local_38;
  code *local_18;
  int local_c;
  PatternView *local_8;
  
  pPVar7 = in_RDI;
  local_18 = in_RCX;
  local_c = in_EDX;
  local_8 = in_RSI;
  iVar3 = PatternView::size(in_RSI);
  if (iVar3 < local_c) {
    memset(in_RDI,0,0x20);
    PatternView::PatternView(in_RDI);
  }
  else {
    PatternView::subView(in_stack_ffffffffffffffc0,(int)((ulong)pPVar7 >> 0x20),(int)pPVar7);
    bVar2 = PatternView::isAtFirstBar(&local_38);
    pcVar1 = local_18;
    if (bVar2) {
      std::numeric_limits<int>::max();
      uVar6 = (*pcVar1)(&local_38);
      if ((uVar6 & 1) != 0) {
        in_RDI->_data = local_38._data;
        in_RDI->_size = local_38._size;
        *(undefined4 *)&in_RDI->field_0xc = local_38._12_4_;
        in_RDI->_base = local_38._base;
        in_RDI->_end = local_38._end;
        return pPVar7;
      }
    }
    puVar4 = PatternView::end(local_8);
    puVar4 = puVar4 + -(long)local_c;
    while (puVar5 = PatternView::data(&local_38), pcVar1 = local_18, puVar5 < puVar4) {
      PatternView::operator[](&local_38,-1);
      uVar6 = (*pcVar1)(&local_38);
      if ((uVar6 & 1) != 0) {
        in_RDI->_data = local_38._data;
        in_RDI->_size = local_38._size;
        *(undefined4 *)&in_RDI->field_0xc = local_38._12_4_;
        in_RDI->_base = local_38._base;
        in_RDI->_end = local_38._end;
        return pPVar7;
      }
      PatternView::skipPair((PatternView *)0x28c4a9);
    }
    memset(in_RDI,0,0x20);
    PatternView::PatternView(in_RDI);
  }
  return pPVar7;
}

Assistant:

PatternView FindLeftGuard(const PatternView& view, int minSize, Pred isGuard)
{
	if (view.size() < minSize)
		return {};

	auto window = view.subView(0, LEN);
	if (window.isAtFirstBar() && isGuard(window, std::numeric_limits<int>::max()))
		return window;
	for (auto end = view.end() - minSize; window.data() < end; window.skipPair())
		if (isGuard(window, window[-1]))
			return window;

	return {};
}